

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStr.c
# Opt level: O3

void Str_MuxStructDump_rec(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Str_t *vStr)

{
  char cVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  size_t sVar4;
  uint uVar5;
  char *pcVar6;
  ulong uVar7;
  bool bVar8;
  char local_48 [24];
  
  if ((pObj->field_0x3 & 0x40) == 0) {
    return;
  }
  uVar5 = vStr->nSize;
  if (uVar5 == vStr->nCap) {
    if ((int)uVar5 < 0x10) {
      if (vStr->pArray == (char *)0x0) {
        pcVar6 = (char *)malloc(0x10);
      }
      else {
        pcVar6 = (char *)realloc(vStr->pArray,0x10);
      }
      vStr->pArray = pcVar6;
      vStr->nCap = 0x10;
    }
    else {
      sVar4 = (ulong)uVar5 * 2;
      if (vStr->pArray == (char *)0x0) {
        pcVar6 = (char *)malloc(sVar4);
      }
      else {
        pcVar6 = (char *)realloc(vStr->pArray,sVar4);
      }
      vStr->pArray = pcVar6;
      vStr->nCap = (int)sVar4;
    }
  }
  else {
    pcVar6 = vStr->pArray;
  }
  iVar2 = vStr->nSize;
  vStr->nSize = iVar2 + 1;
  pcVar6[iVar2] = '[';
  uVar5 = vStr->nSize;
  if (uVar5 == vStr->nCap) {
    if ((int)uVar5 < 0x10) {
      if (vStr->pArray == (char *)0x0) {
        pcVar6 = (char *)malloc(0x10);
      }
      else {
        pcVar6 = (char *)realloc(vStr->pArray,0x10);
      }
      vStr->pArray = pcVar6;
      vStr->nCap = 0x10;
    }
    else {
      sVar4 = (ulong)uVar5 * 2;
      if (vStr->pArray == (char *)0x0) {
        pcVar6 = (char *)malloc(sVar4);
      }
      else {
        pcVar6 = (char *)realloc(vStr->pArray,sVar4);
      }
      vStr->pArray = pcVar6;
      vStr->nCap = (int)sVar4;
    }
  }
  else {
    pcVar6 = vStr->pArray;
  }
  iVar2 = vStr->nSize;
  vStr->nSize = iVar2 + 1;
  pcVar6[iVar2] = '(';
  if (p->pMuxes == (uint *)0x0) {
LAB_007e29a3:
    uVar5 = vStr->nSize;
    if (uVar5 == vStr->nCap) {
      if ((int)uVar5 < 0x10) {
        if (vStr->pArray == (char *)0x0) {
          pcVar6 = (char *)malloc(0x10);
        }
        else {
          pcVar6 = (char *)realloc(vStr->pArray,0x10);
        }
        vStr->pArray = pcVar6;
        vStr->nCap = 0x10;
      }
      else {
        sVar4 = (ulong)uVar5 * 2;
        if (vStr->pArray == (char *)0x0) {
          pcVar6 = (char *)malloc(sVar4);
        }
        else {
          pcVar6 = (char *)realloc(vStr->pArray,sVar4);
        }
        vStr->pArray = pcVar6;
        vStr->nCap = (int)sVar4;
      }
    }
    else {
      pcVar6 = vStr->pArray;
    }
    iVar2 = vStr->nSize;
    vStr->nSize = iVar2 + 1;
    pcVar6[iVar2] = '-';
    uVar5 = 1;
LAB_007e2a28:
    uVar7 = 0xffffffffffffffff;
    do {
      local_48[uVar7 + 1] = (char)uVar5 + (char)(uVar5 / 10) * -10;
      uVar7 = uVar7 + 1;
      bVar8 = 9 < uVar5;
      uVar5 = uVar5 / 10;
    } while (bVar8);
    do {
      cVar1 = local_48[uVar7 & 0xffffffff];
      uVar5 = vStr->nSize;
      if (uVar5 == vStr->nCap) {
        if ((int)uVar5 < 0x10) {
          if (vStr->pArray == (char *)0x0) {
            pcVar6 = (char *)malloc(0x10);
          }
          else {
            pcVar6 = (char *)realloc(vStr->pArray,0x10);
          }
          vStr->pArray = pcVar6;
          vStr->nCap = 0x10;
        }
        else {
          sVar4 = (ulong)uVar5 * 2;
          if (vStr->pArray == (char *)0x0) {
            pcVar6 = (char *)malloc(sVar4);
          }
          else {
            pcVar6 = (char *)realloc(vStr->pArray,sVar4);
          }
          vStr->pArray = pcVar6;
          vStr->nCap = (int)sVar4;
        }
      }
      else {
        pcVar6 = vStr->pArray;
      }
      iVar2 = vStr->nSize;
      vStr->nSize = iVar2 + 1;
      pcVar6[iVar2] = cVar1 + '0';
      uVar7 = uVar7 - 1;
    } while (1 < (int)uVar7 + 2);
  }
  else {
    pGVar3 = p->pObjs;
    if ((pObj < pGVar3) || (pGVar3 + p->nObjs <= pObj)) goto LAB_007e2d7d;
    uVar5 = p->pMuxes[(int)((ulong)((long)pObj - (long)pGVar3) >> 2) * -0x55555555];
    if (uVar5 == 0) goto LAB_007e29a3;
    if ((int)uVar5 < 0) {
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                    ,0x12f,"int Abc_Lit2Var(int)");
    }
    if (uVar5 != 1) {
      uVar5 = uVar5 >> 1;
      goto LAB_007e2a28;
    }
    uVar5 = vStr->nSize;
    if (uVar5 == vStr->nCap) {
      if ((int)uVar5 < 0x10) {
        if (vStr->pArray == (char *)0x0) {
          pcVar6 = (char *)malloc(0x10);
        }
        else {
          pcVar6 = (char *)realloc(vStr->pArray,0x10);
        }
        vStr->pArray = pcVar6;
        vStr->nCap = 0x10;
      }
      else {
        sVar4 = (ulong)uVar5 * 2;
        if (vStr->pArray == (char *)0x0) {
          pcVar6 = (char *)malloc(sVar4);
        }
        else {
          pcVar6 = (char *)realloc(vStr->pArray,sVar4);
        }
        vStr->pArray = pcVar6;
        vStr->nCap = (int)sVar4;
      }
    }
    else {
      pcVar6 = vStr->pArray;
    }
    iVar2 = vStr->nSize;
    vStr->nSize = iVar2 + 1;
    pcVar6[iVar2] = '0';
  }
  uVar5 = vStr->nSize;
  if (uVar5 == vStr->nCap) {
    if ((int)uVar5 < 0x10) {
      if (vStr->pArray == (char *)0x0) {
        pcVar6 = (char *)malloc(0x10);
      }
      else {
        pcVar6 = (char *)realloc(vStr->pArray,0x10);
      }
      vStr->pArray = pcVar6;
      vStr->nCap = 0x10;
    }
    else {
      sVar4 = (ulong)uVar5 * 2;
      if (vStr->pArray == (char *)0x0) {
        pcVar6 = (char *)malloc(sVar4);
      }
      else {
        pcVar6 = (char *)realloc(vStr->pArray,sVar4);
      }
      vStr->pArray = pcVar6;
      vStr->nCap = (int)sVar4;
    }
  }
  else {
    pcVar6 = vStr->pArray;
  }
  iVar2 = vStr->nSize;
  vStr->nSize = iVar2 + 1;
  pcVar6[iVar2] = ')';
  if (p->pMuxes == (uint *)0x0) {
LAB_007e2ba5:
    uVar5 = *(uint *)&pObj->field_0x4;
  }
  else {
    pGVar3 = p->pObjs;
    if ((pObj < pGVar3) || (pGVar3 + p->nObjs <= pObj)) goto LAB_007e2d7d;
    uVar5 = p->pMuxes[(int)((ulong)((long)pObj - (long)pGVar3) >> 2) * -0x55555555];
    if ((int)uVar5 < 0) goto LAB_007e2d9c;
    if ((uVar5 & 1) == 0) goto LAB_007e2ba5;
    uVar5 = (uint)*(undefined8 *)pObj;
  }
  Str_MuxStructDump_rec(p,pObj + -(ulong)(uVar5 & 0x1fffffff),vStr);
  uVar5 = vStr->nSize;
  if (uVar5 == vStr->nCap) {
    if ((int)uVar5 < 0x10) {
      if (vStr->pArray == (char *)0x0) {
        pcVar6 = (char *)malloc(0x10);
      }
      else {
        pcVar6 = (char *)realloc(vStr->pArray,0x10);
      }
      vStr->pArray = pcVar6;
      vStr->nCap = 0x10;
    }
    else {
      sVar4 = (ulong)uVar5 * 2;
      if (vStr->pArray == (char *)0x0) {
        pcVar6 = (char *)malloc(sVar4);
      }
      else {
        pcVar6 = (char *)realloc(vStr->pArray,sVar4);
      }
      vStr->pArray = pcVar6;
      vStr->nCap = (int)sVar4;
    }
  }
  else {
    pcVar6 = vStr->pArray;
  }
  iVar2 = vStr->nSize;
  vStr->nSize = iVar2 + 1;
  pcVar6[iVar2] = '|';
  if (p->pMuxes != (uint *)0x0) {
    pGVar3 = p->pObjs;
    if ((pObj < pGVar3) || (pGVar3 + p->nObjs <= pObj)) {
LAB_007e2d7d:
      __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                    ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
    }
    uVar5 = p->pMuxes[(int)((ulong)((long)pObj - (long)pGVar3) >> 2) * -0x55555555];
    if ((int)uVar5 < 0) {
LAB_007e2d9c:
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                    ,0x130,"int Abc_LitIsCompl(int)");
    }
    if ((uVar5 & 1) != 0) {
      uVar5 = *(uint *)&pObj->field_0x4;
      goto LAB_007e2c92;
    }
  }
  uVar5 = (uint)*(undefined8 *)pObj;
LAB_007e2c92:
  Str_MuxStructDump_rec(p,pObj + -(ulong)(uVar5 & 0x1fffffff),vStr);
  uVar5 = vStr->nSize;
  if (uVar5 == vStr->nCap) {
    if ((int)uVar5 < 0x10) {
      if (vStr->pArray == (char *)0x0) {
        pcVar6 = (char *)malloc(0x10);
      }
      else {
        pcVar6 = (char *)realloc(vStr->pArray,0x10);
      }
      vStr->pArray = pcVar6;
      vStr->nCap = 0x10;
    }
    else {
      sVar4 = (ulong)uVar5 * 2;
      if (vStr->pArray == (char *)0x0) {
        pcVar6 = (char *)malloc(sVar4);
      }
      else {
        pcVar6 = (char *)realloc(vStr->pArray,sVar4);
      }
      vStr->pArray = pcVar6;
      vStr->nCap = (int)sVar4;
    }
  }
  else {
    pcVar6 = vStr->pArray;
  }
  iVar2 = vStr->nSize;
  vStr->nSize = iVar2 + 1;
  pcVar6[iVar2] = ']';
  return;
}

Assistant:

void Str_MuxStructDump_rec( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Str_t * vStr )
{
    if ( !pObj->fMark0 )
        return;
    Vec_StrPush( vStr, '[' );
    Vec_StrPush( vStr, '(' );
    Vec_StrPrintNum( vStr, Gia_ObjFaninId2p(p, pObj) );
    Vec_StrPush( vStr, ')' );
    Str_MuxStructDump_rec( p, Gia_ObjFaninC2(p, pObj) ? Gia_ObjFanin0(pObj) : Gia_ObjFanin1(pObj), vStr );
    Vec_StrPush( vStr, '|' );
    Str_MuxStructDump_rec( p, Gia_ObjFaninC2(p, pObj) ? Gia_ObjFanin1(pObj) : Gia_ObjFanin0(pObj), vStr );
    Vec_StrPush( vStr, ']' );
}